

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

Time absl::lts_20250127::FromUniversal(int64_t universal)

{
  undefined8 in_RCX;
  Time lhs;
  Duration DVar1;
  Duration rhs;
  undefined4 local_68;
  int64_t universal_local;
  
  lhs = UniversalEpoch();
  DVar1 = Nanoseconds<long,_0>(universal);
  local_68 = DVar1.rep_lo_;
  rhs.rep_hi_.hi_ = 0;
  rhs.rep_hi_.lo_ = local_68;
  rhs.rep_lo_ = (uint32_t)in_RCX;
  DVar1 = operator*((lts_20250127 *)0x64,DVar1.rep_hi_.lo_,rhs);
  DVar1 = (Duration)operator+(lhs,DVar1);
  return (Time)DVar1;
}

Assistant:

absl::Time FromUniversal(int64_t universal) {
  return absl::UniversalEpoch() + 100 * absl::Nanoseconds(universal);
}